

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

char * get_token_lexeme(VrplibParser *p)

{
  byte bVar1;
  byte *__src;
  long lVar2;
  ushort **ppuVar3;
  char *pcVar4;
  long lVar5;
  byte *pbVar6;
  size_t __n;
  
  parser_eat_whitespaces(p);
  pcVar4 = p->base;
  lVar2 = -p->size;
  __src = (byte *)p->at;
  lVar5 = (long)pcVar4 - (long)__src;
  pbVar6 = __src;
  if (lVar5 != lVar2) {
    do {
      bVar1 = *pbVar6;
      if (((0x2e < (ulong)bVar1) || ((0x680000000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
         (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(char)bVar1] & 8) == 0)) break;
      pbVar6 = pbVar6 + (lVar5 != lVar2);
      p->at = (char *)pbVar6;
      lVar5 = (long)pcVar4 - (long)pbVar6;
    } while (lVar5 != lVar2);
    if (pbVar6 != __src) {
      __n = (long)pbVar6 - (long)__src;
      pcVar4 = (char *)malloc(__n + 1);
      if (pcVar4 != (char *)0x0) {
        strncpy(pcVar4,(char *)__src,__n);
        pcVar4[__n] = '\0';
        parser_eat_whitespaces(p);
        return pcVar4;
      }
      log_log(0x80,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/parser.c"
              ,0x1a0,"Failed memory allocation");
      return (char *)0x0;
    }
  }
  parser_eat_whitespaces(p);
  return (char *)0x0;
}

Assistant:

static char *get_token_lexeme(VrplibParser *p) {
    parser_eat_whitespaces(p);
    char *at = p->at;

    while (!parser_is_eof(p) && (*p->at == '-' || *p->at == '+' ||
                                 *p->at == '.' || isalnum(*p->at))) {
        parser_adv(p, 1);
    }

    intptr_t toksize = p->at - at;

    if (toksize != 0) {
        char *lexeme = malloc(toksize + 1);
        if (!lexeme) {
            log_fatal("Failed memory allocation");
            return NULL;
        }

        strncpy(lexeme, at, toksize);
        lexeme[toksize] = '\0';
        parser_eat_whitespaces(p);
        return lexeme;
    }

    parser_eat_whitespaces(p);
    return NULL;
}